

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_bind.c
# Opt level: O0

int main(int argc,char **argv)

{
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  undefined8 uVar1;
  long in_RSI;
  int in_EDI;
  amqp_connection_state_t conn;
  amqp_socket_t *socket;
  char *queue;
  char *bindingkey;
  char *exchange;
  int status;
  int port;
  char *hostname;
  undefined8 in_stack_fffffffffffffeb8;
  uint uVar2;
  int x_04;
  undefined1 local_118 [8];
  char *in_stack_fffffffffffffef0;
  char *local_108;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  undefined1 local_68 [32];
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long local_10;
  int local_4;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_4 = 0;
  local_40 = 0;
  if (in_EDI < 6) {
    fprintf(_stderr,"Usage: amqp_bind host port exchange bindingkey queue\n");
    local_4 = 1;
  }
  else {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_10 = in_RSI;
    local_1c = atoi(*(char **)(in_RSI + 0x10));
    local_28 = *(undefined8 *)(local_10 + 0x18);
    local_30 = *(undefined8 *)(local_10 + 0x20);
    local_38 = *(undefined8 *)(local_10 + 0x28);
    local_48 = amqp_new_connection();
    local_40 = amqp_tcp_socket_new(local_48);
    if (local_40 == 0) {
      die("creating TCP socket");
    }
    local_20 = amqp_socket_open(local_40,local_18,local_1c);
    if (local_20 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_68,local_48,"/",0,0x20000,0,(ulong)uVar2 << 0x20,"guest","guest");
    x.reply._0_8_ = in_stack_ffffffffffffff08;
    x._0_8_ = in_stack_ffffffffffffff00;
    x.reply.decoded = (void *)in_stack_ffffffffffffff10;
    x._24_8_ = in_stack_ffffffffffffff18;
    die_on_amqp_error(x,in_stack_fffffffffffffef0);
    amqp_channel_open(local_48,1);
    amqp_get_rpc_reply(local_88,local_48);
    x_00.reply._0_8_ = in_stack_ffffffffffffff08;
    x_00._0_8_ = in_stack_ffffffffffffff00;
    x_00.reply.decoded = (void *)in_stack_ffffffffffffff10;
    x_00._24_8_ = in_stack_ffffffffffffff18;
    die_on_amqp_error(x_00,in_stack_fffffffffffffef0);
    uVar1 = local_48;
    local_98 = amqp_cstring_bytes(local_38);
    local_a8 = amqp_cstring_bytes(local_28);
    local_b8 = amqp_cstring_bytes(local_30);
    amqp_queue_bind(uVar1,1,local_98._0_8_,local_98._8_8_,local_a8._0_8_,local_a8._8_8_,local_b8,
                    _amqp_empty_table,_usleep);
    amqp_get_rpc_reply(local_d8,local_48);
    x_01.reply._0_8_ = in_stack_ffffffffffffff08;
    x_01._0_8_ = in_stack_ffffffffffffff00;
    x_01.reply.decoded = (void *)in_stack_ffffffffffffff10;
    x_01._24_8_ = in_stack_ffffffffffffff18;
    die_on_amqp_error(x_01,in_stack_fffffffffffffef0);
    amqp_channel_close(&stack0xffffffffffffff08,local_48,1,200);
    x_02.reply._0_8_ = in_stack_ffffffffffffff08;
    x_02._0_8_ = in_stack_ffffffffffffff00;
    x_02.reply.decoded = (void *)in_stack_ffffffffffffff10;
    x_02._24_8_ = in_stack_ffffffffffffff18;
    die_on_amqp_error(x_02,in_stack_fffffffffffffef0);
    amqp_connection_close(local_118,local_48,200);
    x_03.reply._0_8_ = in_stack_ffffffffffffff08;
    x_03._0_8_ = in_stack_ffffffffffffff00;
    x_03.reply.decoded = (void *)in_stack_ffffffffffffff10;
    x_03._24_8_ = in_stack_ffffffffffffff18;
    die_on_amqp_error(x_03,in_stack_fffffffffffffef0);
    x_04 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    amqp_destroy_connection(local_48);
    die_on_error(x_04,local_108);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *bindingkey;
  char const *queue;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  if (argc < 6) {
    fprintf(stderr, "Usage: amqp_bind host port exchange bindingkey queue\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  bindingkey = argv[4];
  queue = argv[5];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  amqp_queue_bind(conn, 1,
                  amqp_cstring_bytes(queue),
                  amqp_cstring_bytes(exchange),
                  amqp_cstring_bytes(bindingkey),
                  amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Unbinding");

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");
  return 0;
}